

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

Pass * wasm::createGUFAOptimizingPass(void)

{
  GUFAPass *this;
  
  this = (GUFAPass *)operator_new(0x60);
  anon_unknown_174::GUFAPass::GUFAPass(this,true,false);
  return &this->super_Pass;
}

Assistant:

Pass* createGUFAOptimizingPass() { return new GUFAPass(true, false); }